

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

string * __thiscall Object::asString_abi_cxx11_(string *__return_storage_ptr__,Object *this)

{
  string local_50;
  allocator<char> local_1a;
  undefined1 local_19;
  Object *local_18;
  Object *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Object *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{\n",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  Environment::toString_abi_cxx11_(&local_50,&this->members,true);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string Object::asString() {
    std::string result = "{\n";
    result += members.toString(true);
    result += "}";
    return result;
}